

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

void tb_set_jmp_target_s390x(TranslationBlock *tb,int n,uintptr_t addr)

{
  void *pvVar1;
  
  pvVar1 = (tb->tc).ptr;
  *(int *)(tb->jmp_target_arg[n] + (long)pvVar1) =
       ((int)addr - ((int)tb->jmp_target_arg[n] + (int)pvVar1)) + -4;
  return;
}

Assistant:

void tb_set_jmp_target(TranslationBlock *tb, int n, uintptr_t addr)
{
    if (TCG_TARGET_HAS_direct_jump) {
        uintptr_t offset = tb->jmp_target_arg[n];
        uintptr_t tc_ptr = (uintptr_t)tb->tc.ptr;
        tb_target_set_jmp_target(tc_ptr, tc_ptr + offset, addr);
    } else {
        tb->jmp_target_arg[n] = addr;
    }
}